

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_io_suite.cpp
# Opt level: O2

void ostringstream_suite::run(void)

{
  test_null();
  test_boolean();
  test_integer();
  test_real();
  test_string();
  test_array();
  test_map();
  return;
}

Assistant:

void run()
{
    test_null();
    test_boolean();
    test_integer();
    test_real();
    test_string();
    test_array();
    test_map();
}